

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

void Tim_ManStop(Tim_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pVVar2 = p->vDelayTables;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    iVar1 = pVVar2->nSize;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        if ((void *)0x2 < pVVar2->pArray[lVar3]) {
          free(pVVar2->pArray[lVar3]);
          iVar1 = pVVar2->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
  }
  pVVar2 = p->vBoxes;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vBoxes->pArray = (void **)0x0;
      pVVar2 = p->vBoxes;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_0041d8f1;
    }
    free(pVVar2);
    p->vBoxes = (Vec_Ptr_t *)0x0;
  }
LAB_0041d8f1:
  Mem_FlexStop(p->pMemObj,0);
  if (p->pCis != (Tim_Obj_t *)0x0) {
    free(p->pCis);
    p->pCis = (Tim_Obj_t *)0x0;
  }
  if (p->pCos != (Tim_Obj_t *)0x0) {
    free(p->pCos);
  }
  free(p);
  return;
}

Assistant:

void Tim_ManStop( Tim_Man_t * p )
{
    Vec_PtrFreeFree( p->vDelayTables );
    Vec_PtrFreeP( &p->vBoxes );
    Mem_FlexStop( p->pMemObj, 0 );
    ABC_FREE( p->pCis );
    ABC_FREE( p->pCos );
    ABC_FREE( p );
}